

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sumofintegerfromfile.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  uint uVar1;
  char *__nptr;
  char cVar2;
  int *n;
  istream *piVar3;
  uint *puVar4;
  long lVar5;
  pointer piVar6;
  long *plVar7;
  undefined8 uVar8;
  int iVar9;
  vector<int,_std::allocator<int>_> nums;
  string line;
  ifstream stream;
  int local_27c;
  vector<int,_std::allocator<int>_> local_278;
  char *local_260;
  undefined8 local_258;
  char local_250 [16];
  char *local_240;
  long local_238 [65];
  
  std::ifstream::ifstream((istream *)local_238,"/home/arkezar/fib",_S_in);
  local_260 = local_250;
  local_258 = 0;
  local_250[0] = '\0';
  local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (int *)0x0;
  while( true ) {
    cVar2 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + (char)(istream *)local_238
                           );
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_238,(string *)&local_260,cVar2);
    __nptr = local_260;
    if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) {
      iVar9 = 0;
      for (piVar6 = local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          piVar6 != local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish; piVar6 = piVar6 + 1) {
        iVar9 = iVar9 + *piVar6;
      }
      plVar7 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar9);
      std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
      std::ostream::put((char)plVar7);
      std::ostream::flush();
      if (local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (int *)0x0) {
        operator_delete(local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_260 != local_250) {
        operator_delete(local_260);
      }
      std::ifstream::~ifstream(local_238);
      return 0;
    }
    puVar4 = (uint *)__errno_location();
    uVar1 = *puVar4;
    *puVar4 = 0;
    lVar5 = strtol(__nptr,&local_240,10);
    if (local_240 == __nptr) break;
    iVar9 = (int)lVar5;
    if ((iVar9 != lVar5) || (*puVar4 == 0x22)) goto LAB_00101458;
    if (*puVar4 == 0) {
      *puVar4 = uVar1;
    }
    local_27c = iVar9;
    if (local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&local_278,
                 (iterator)
                 local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,&local_27c);
    }
    else {
      *local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish = iVar9;
      local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
  }
  std::__throw_invalid_argument("stoi");
LAB_00101458:
  uVar8 = std::__throw_out_of_range("stoi");
  if (local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_260 != (char *)(ulong)uVar1) {
    operator_delete(local_260);
  }
  std::ifstream::~ifstream(local_238);
  _Unwind_Resume(uVar8);
}

Assistant:

int main(int argc, char *argv[]) {
//    ifstream stream(argv[1]);
    ifstream stream("/home/arkezar/fib");
    string line;
    vector<int> nums;
    while (getline(stream, line)) {
        nums.push_back(stoi(line));
    }
    int sum = 0;
    for(const auto& n : nums)
        sum += n;
    cout << sum << endl;
    return 0;
}